

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_k_means_avx2.c
# Opt level: O0

void av1_calc_indices_dim2_avx2
               (int16_t *data,int16_t *centroids,uint8_t *indices,int64_t *total_dist,int n,int k)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [32];
  undefined1 auVar4 [32];
  __m256i a;
  undefined1 auVar5 [32];
  undefined1 auVar6 [32];
  undefined1 auVar7 [32];
  undefined1 auVar8 [32];
  undefined1 auVar9 [32];
  undefined1 auVar10 [32];
  undefined1 auVar11 [32];
  undefined1 auVar12 [32];
  undefined8 uVar13;
  undefined8 uVar14;
  undefined8 uVar15;
  int64_t iVar16;
  int64_t *in_RCX;
  long lVar17;
  undefined8 *in_RDX;
  long in_RSI;
  undefined1 (*in_RDI) [32];
  int in_R8D;
  int in_R9D;
  __m128i d5;
  __m256i d4;
  __m256i d3;
  __m256i d2;
  __m256i dist2;
  __m256i dist1;
  __m256i ind1;
  __m256i cmp;
  __m256i dist;
  int j_1;
  __m256i dist_min;
  __m256i d1;
  __m256i in;
  int l;
  int i;
  int16_t cy;
  int16_t cx;
  int j;
  __m256i cents [8];
  __m256i ind [2];
  __m256i sum;
  __m256i permute;
  __m256i v_zero;
  undefined8 local_940;
  undefined8 uStackY_938;
  undefined8 local_920;
  undefined8 uStackY_918;
  undefined8 uStackY_910;
  undefined8 in_stack_fffffffffffff6f8;
  undefined8 in_stack_fffffffffffff700;
  undefined8 in_stack_fffffffffffff708;
  longlong in_stack_fffffffffffff710;
  undefined8 uStack_8e8;
  undefined8 local_8e0;
  undefined8 uStack_8d8;
  undefined8 uStack_8d0;
  undefined8 uStack_8c8;
  undefined8 local_8c0;
  undefined8 uStack_8b8;
  undefined8 uStack_8b0;
  undefined8 uStack_8a8;
  undefined8 local_860;
  undefined8 uStack_858;
  undefined8 uStack_850;
  undefined8 uStack_848;
  uint local_824;
  undefined1 local_820 [32];
  undefined8 local_800;
  undefined8 uStack_7f8;
  undefined8 uStack_7f0;
  undefined8 uStack_7e8;
  int local_7b0;
  int local_7ac;
  int local_7a4;
  undefined8 local_7a0 [32];
  undefined8 local_6a0 [4];
  undefined8 local_680;
  undefined8 uStack_678;
  undefined8 uStack_670;
  undefined8 uStack_668;
  undefined1 local_660 [32];
  undefined8 local_640;
  undefined8 uStack_638;
  undefined8 uStack_630;
  undefined8 uStack_628;
  undefined8 local_620;
  undefined8 uStack_618;
  undefined8 uStack_610;
  undefined8 uStack_608;
  int local_5e8;
  int local_5e4;
  int64_t *local_5e0;
  undefined8 *local_5d8;
  long local_5d0;
  undefined1 (*local_5c8) [32];
  undefined1 local_5c0 [32];
  undefined8 local_5a0;
  undefined8 uStack_598;
  undefined8 uStack_590;
  undefined8 uStack_588;
  undefined8 local_580;
  undefined8 uStack_578;
  undefined8 uStack_570;
  undefined8 uStack_568;
  undefined1 (*local_548) [32];
  undefined8 local_540;
  undefined8 uStack_538;
  undefined8 uStack_530;
  undefined8 uStack_528;
  undefined8 local_520;
  undefined8 uStack_518;
  undefined8 uStack_510;
  undefined8 uStack_508;
  undefined8 local_500;
  undefined8 uStack_4f8;
  undefined8 uStack_4f0;
  undefined8 uStack_4e8;
  undefined8 local_4e0;
  undefined8 uStack_4d8;
  undefined8 uStack_4d0;
  undefined8 uStack_4c8;
  undefined1 local_4c0 [32];
  undefined1 local_4a0 [32];
  undefined8 local_480;
  undefined8 uStack_478;
  undefined8 uStack_470;
  undefined8 uStack_468;
  undefined1 local_460 [32];
  undefined8 local_440;
  undefined8 uStack_438;
  undefined8 uStack_430;
  undefined8 uStack_428;
  undefined1 local_420 [32];
  undefined8 local_400;
  undefined8 uStack_3f8;
  undefined8 uStack_3f0;
  undefined8 uStack_3e8;
  undefined8 local_3e0;
  undefined8 uStack_3d8;
  longlong lStack_3d0;
  undefined8 uStack_3c8;
  undefined8 local_3c0;
  undefined8 uStack_3b8;
  undefined8 *local_3a8;
  undefined8 local_3a0;
  undefined8 uStack_398;
  undefined8 uStack_390;
  undefined8 uStack_388;
  undefined8 local_380;
  undefined8 uStack_378;
  undefined8 uStack_370;
  undefined8 uStack_368;
  undefined8 local_360;
  undefined8 uStack_358;
  undefined8 uStack_350;
  undefined8 uStack_348;
  undefined8 local_340;
  undefined8 uStack_338;
  undefined8 uStack_330;
  undefined8 uStack_328;
  undefined8 local_320;
  undefined8 uStack_318;
  undefined8 uStack_310;
  undefined8 uStack_308;
  undefined8 local_300;
  undefined8 uStack_2f8;
  undefined8 uStack_2f0;
  undefined8 uStack_2e8;
  undefined8 local_2e0;
  undefined8 uStack_2d8;
  undefined8 uStack_2d0;
  undefined8 uStack_2c8;
  undefined8 local_2c0;
  undefined8 uStack_2b8;
  undefined8 uStack_2b0;
  undefined8 uStack_2a8;
  undefined8 local_2a0;
  undefined8 uStack_298;
  undefined8 uStack_290;
  undefined8 uStack_288;
  undefined8 local_280;
  undefined8 uStack_278;
  undefined8 uStack_270;
  undefined8 uStack_268;
  undefined8 local_260;
  undefined8 uStack_258;
  undefined8 uStack_250;
  undefined8 uStack_248;
  undefined8 local_240;
  undefined8 uStack_238;
  undefined8 uStack_230;
  undefined8 uStack_228;
  undefined1 local_220 [16];
  undefined1 auStack_210 [16];
  undefined4 local_200;
  undefined4 local_1fc;
  undefined4 local_1f8;
  undefined4 local_1f4;
  undefined4 local_1f0;
  undefined4 local_1ec;
  undefined4 local_1e8;
  undefined4 local_1e4;
  undefined1 local_1e0 [32];
  ushort local_1c0;
  ushort local_1be;
  ushort local_1bc;
  ushort local_1ba;
  ushort local_1b8;
  ushort local_1b6;
  ushort local_1b4;
  ushort local_1b2;
  ushort local_1b0;
  ushort local_1ae;
  ushort local_1ac;
  ushort local_1aa;
  ushort local_1a8;
  ushort local_1a6;
  ushort local_1a4;
  ushort local_1a2;
  undefined8 local_1a0;
  undefined8 uStack_198;
  undefined8 uStack_190;
  undefined8 uStack_188;
  undefined8 local_180;
  undefined8 uStack_178;
  undefined8 uStack_170;
  undefined8 uStack_168;
  undefined8 local_160;
  undefined8 uStack_158;
  undefined8 uStack_150;
  undefined8 uStack_148;
  undefined8 local_140;
  undefined8 uStack_138;
  undefined8 uStack_130;
  undefined8 uStack_128;
  uint local_104;
  undefined1 local_100 [16];
  undefined1 auStack_f0 [16];
  uint local_e0;
  uint local_dc;
  uint local_d8;
  uint local_d4;
  uint local_d0;
  uint local_cc;
  uint local_c8;
  uint local_c4;
  undefined8 local_c0;
  undefined8 uStack_b8;
  undefined8 uStack_b0;
  undefined8 uStack_a8;
  undefined8 local_a0;
  undefined8 uStack_98;
  undefined8 uStack_90;
  undefined8 uStack_88;
  undefined8 local_80;
  undefined8 uStack_78;
  undefined8 uStack_70;
  undefined8 uStack_68;
  undefined8 local_60;
  undefined8 uStack_58;
  undefined8 uStack_50;
  undefined8 uStack_48;
  
  local_580 = 0;
  uStack_578 = 0;
  uStack_570 = 0;
  uStack_568 = 0;
  local_620 = 0;
  uStack_618 = 0;
  uStack_610 = 0;
  uStack_608 = 0;
  local_1e4 = 0;
  local_1e8 = 0;
  local_1ec = 0;
  local_1f0 = 0;
  local_1f4 = 5;
  local_1f8 = 1;
  local_1fc = 4;
  local_200 = 0;
  auVar1 = vpinsrd_avx(ZEXT416(0),4,1);
  auVar1 = vpinsrd_avx(auVar1,1,2);
  local_220 = vpinsrd_avx(auVar1,5,3);
  auVar1 = vpinsrd_avx(ZEXT416(0),0,1);
  auVar1 = vpinsrd_avx(auVar1,0,2);
  auStack_210 = vpinsrd_avx(auVar1,0,3);
  auVar2 = auStack_210;
  auVar1 = local_220;
  local_640 = local_220._0_8_;
  uStack_638 = local_220._8_8_;
  uStack_630 = auStack_210._0_8_;
  uStack_628 = auStack_210._8_8_;
  local_5a0 = 0;
  uStack_598 = 0;
  uStack_590 = 0;
  uStack_588 = 0;
  local_660 = ZEXT1632(ZEXT816(0));
  local_5e8 = in_R9D;
  local_5e4 = in_R8D;
  local_5e0 = in_RCX;
  local_5d8 = in_RDX;
  local_5d0 = in_RSI;
  local_5c8 = in_RDI;
  local_220 = auVar1;
  auStack_210 = auVar2;
  for (local_7a4 = 0; local_7a4 < local_5e8; local_7a4 = local_7a4 + 1) {
    local_1a4 = *(ushort *)(local_5d0 + (long)(local_7a4 * 2) * 2);
    local_1a2 = *(ushort *)(local_5d0 + 2 + (long)(local_7a4 * 2) * 2);
    local_1a6 = local_1a2;
    local_1a8 = local_1a4;
    local_1aa = local_1a2;
    local_1ac = local_1a4;
    local_1ae = local_1a2;
    local_1b0 = local_1a4;
    local_1b2 = local_1a2;
    local_1b4 = local_1a4;
    local_1b6 = local_1a2;
    local_1b8 = local_1a4;
    local_1ba = local_1a2;
    local_1bc = local_1a4;
    local_1be = local_1a2;
    local_1c0 = local_1a4;
    auVar1 = vpinsrw_avx(ZEXT216(local_1a4),(uint)local_1a2,1);
    auVar1 = vpinsrw_avx(auVar1,(uint)local_1a4,2);
    auVar1 = vpinsrw_avx(auVar1,(uint)local_1a2,3);
    auVar1 = vpinsrw_avx(auVar1,(uint)local_1a4,4);
    auVar1 = vpinsrw_avx(auVar1,(uint)local_1a2,5);
    auVar1 = vpinsrw_avx(auVar1,(uint)local_1a4,6);
    auVar1 = vpinsrw_avx(auVar1,(uint)local_1a2,7);
    auVar2 = vpinsrw_avx(ZEXT216(local_1a4),(uint)local_1a2,1);
    auVar2 = vpinsrw_avx(auVar2,(uint)local_1a4,2);
    auVar2 = vpinsrw_avx(auVar2,(uint)local_1a2,3);
    auVar2 = vpinsrw_avx(auVar2,(uint)local_1a4,4);
    auVar2 = vpinsrw_avx(auVar2,(uint)local_1a2,5);
    auVar2 = vpinsrw_avx(auVar2,(uint)local_1a4,6);
    auVar2 = vpinsrw_avx(auVar2,(uint)local_1a2,7);
    local_1e0._0_16_ = ZEXT116(0) * auVar1 + ZEXT116(1) * auVar2;
    local_1e0._16_16_ = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar1;
    auVar3 = local_1e0;
    uVar13 = local_1e0._8_8_;
    uVar14 = local_1e0._16_8_;
    uVar15 = local_1e0._24_8_;
    lVar17 = (long)local_7a4;
    local_7a0[lVar17 * 4] = local_1e0._0_8_;
    local_1e0 = auVar3;
    local_7a0[lVar17 * 4 + 1] = uVar13;
    local_7a0[lVar17 * 4 + 2] = uVar14;
    local_7a0[lVar17 * 4 + 3] = uVar15;
  }
  for (local_7ac = 0; local_7ac < local_5e4; local_7ac = local_7ac + 0x10) {
    for (local_7b0 = 0; local_7b0 < 2; local_7b0 = local_7b0 + 1) {
      local_548 = local_5c8;
      local_4e0 = *(undefined8 *)*local_5c8;
      uStack_4d8 = *(undefined8 *)(*local_5c8 + 8);
      uStack_4d0 = *(undefined8 *)(*local_5c8 + 0x10);
      uStack_4c8 = *(undefined8 *)(*local_5c8 + 0x18);
      auVar4 = *local_5c8;
      auVar3 = *local_5c8;
      local_5c0 = ZEXT832(0) << 0x20;
      auVar11 = local_5c0;
      local_5c0._8_8_ = SUB328(ZEXT832(0),4);
      lVar17 = (long)local_7b0;
      local_6a0[lVar17 * 4] = 0;
      local_6a0[lVar17 * 4 + 1] = local_5c0._8_8_;
      local_6a0[lVar17 * 4 + 2] = 0;
      local_6a0[lVar17 * 4 + 3] = 0;
      local_500 = local_7a0[0];
      uStack_4f8 = local_7a0[1];
      uStack_4f0 = local_7a0[2];
      uStack_4e8 = local_7a0[3];
      auVar6._8_8_ = local_7a0[1];
      auVar6._0_8_ = local_7a0[0];
      auVar6._16_8_ = local_7a0[2];
      auVar6._24_8_ = local_7a0[3];
      auVar3 = vpsubw_avx2(auVar3,auVar6);
      local_800 = auVar3._0_8_;
      uStack_7f8 = auVar3._8_8_;
      uStack_7f0 = auVar3._16_8_;
      uStack_7e8 = auVar3._24_8_;
      local_340 = local_800;
      uStack_338 = uStack_7f8;
      uStack_330 = uStack_7f0;
      uStack_328 = uStack_7e8;
      local_360 = local_800;
      uStack_358 = uStack_7f8;
      uStack_350 = uStack_7f0;
      uStack_348 = uStack_7e8;
      local_820 = vpmaddwd_avx2(auVar3,auVar3);
      for (local_824 = 1; (int)local_824 < local_5e8; local_824 = local_824 + 1) {
        lVar17 = (long)(int)local_824;
        local_520 = local_4e0;
        uStack_518 = uStack_4d8;
        uStack_510 = uStack_4d0;
        uStack_508 = uStack_4c8;
        local_540 = local_7a0[lVar17 * 4];
        uStack_538 = local_7a0[lVar17 * 4 + 1];
        uStack_530 = local_7a0[lVar17 * 4 + 2];
        uStack_528 = local_7a0[lVar17 * 4 + 3];
        auVar5._8_8_ = local_7a0[lVar17 * 4 + 1];
        auVar5._0_8_ = local_7a0[lVar17 * 4];
        auVar5._16_8_ = local_7a0[lVar17 * 4 + 2];
        auVar5._24_8_ = local_7a0[lVar17 * 4 + 3];
        auVar3 = vpsubw_avx2(auVar4,auVar5);
        local_800 = auVar3._0_8_;
        uStack_7f8 = auVar3._8_8_;
        uStack_7f0 = auVar3._16_8_;
        uStack_7e8 = auVar3._24_8_;
        local_380 = local_800;
        uStack_378 = uStack_7f8;
        uStack_370 = uStack_7f0;
        uStack_368 = uStack_7e8;
        local_3a0 = local_800;
        uStack_398 = uStack_7f8;
        uStack_390 = uStack_7f0;
        uStack_388 = uStack_7e8;
        auVar3 = vpmaddwd_avx2(auVar3,auVar3);
        local_860 = auVar3._0_8_;
        uStack_858 = auVar3._8_8_;
        uStack_850 = auVar3._16_8_;
        uStack_848 = auVar3._24_8_;
        local_180 = local_820._0_8_;
        uStack_178 = local_820._8_8_;
        uStack_170 = local_820._16_8_;
        uStack_168 = local_820._24_8_;
        local_1a0 = local_860;
        uStack_198 = uStack_858;
        uStack_190 = uStack_850;
        uStack_188 = uStack_848;
        local_460 = vpcmpgtd_avx2(local_820,auVar3);
        local_140 = local_820._0_8_;
        uStack_138 = local_820._8_8_;
        uStack_130 = local_820._16_8_;
        uStack_128 = local_820._24_8_;
        local_160 = local_860;
        uStack_158 = uStack_858;
        uStack_150 = uStack_850;
        uStack_148 = uStack_848;
        local_820 = vpminsd_avx2(local_820,auVar3);
        local_104 = local_824;
        local_c4 = local_824;
        local_c8 = local_824;
        local_cc = local_824;
        local_d0 = local_824;
        local_d4 = local_824;
        local_d8 = local_824;
        local_dc = local_824;
        local_e0 = local_824;
        auVar1 = vpinsrd_avx(ZEXT416(local_824),local_824,1);
        auVar1 = vpinsrd_avx(auVar1,local_824,2);
        local_100 = vpinsrd_avx(auVar1,local_824,3);
        auVar1 = vpinsrd_avx(ZEXT416(local_824),local_824,1);
        auVar1 = vpinsrd_avx(auVar1,local_824,2);
        auStack_f0 = vpinsrd_avx(auVar1,local_824,3);
        auVar2 = auStack_f0;
        auVar1 = local_100;
        lVar17 = (long)local_7b0;
        local_480 = local_6a0[lVar17 * 4];
        uStack_478 = local_6a0[lVar17 * 4 + 1];
        uStack_470 = local_6a0[lVar17 * 4 + 2];
        uStack_468 = local_6a0[lVar17 * 4 + 3];
        auVar3 = vpcmpeqd_avx2(local_460,local_460);
        auVar7._8_8_ = local_6a0[lVar17 * 4 + 1];
        auVar7._0_8_ = local_6a0[lVar17 * 4];
        auVar7._16_8_ = local_6a0[lVar17 * 4 + 2];
        auVar7._24_8_ = local_6a0[lVar17 * 4 + 3];
        local_4a0 = vpand_avx2(local_460 ^ auVar3,auVar7);
        local_420 = local_460;
        local_440 = local_100._0_8_;
        uStack_438 = local_100._8_8_;
        uStack_430 = auStack_f0._0_8_;
        uStack_428 = auStack_f0._8_8_;
        auVar8._16_8_ = auStack_f0._0_8_;
        auVar8._0_16_ = local_100;
        auVar8._24_8_ = auStack_f0._8_8_;
        local_4c0 = vpand_avx2(local_460,auVar8);
        auVar3 = vpor_avx2(local_4a0,local_4c0);
        *(undefined1 (*) [32])(local_6a0 + (long)local_7b0 * 4) = auVar3;
        local_100 = auVar1;
        auStack_f0 = auVar2;
      }
      if (local_5e0 != (int64_t *)0x0) {
        local_300 = local_820._0_8_;
        uStack_2f8 = local_820._8_8_;
        uStack_2f0 = local_820._16_8_;
        uStack_2e8 = local_820._24_8_;
        local_320 = local_620;
        uStack_318 = uStack_618;
        uStack_310 = uStack_610;
        uStack_308 = uStack_608;
        auVar9._8_8_ = uStack_618;
        auVar9._0_8_ = local_620;
        auVar9._16_8_ = uStack_610;
        auVar9._24_8_ = uStack_608;
        auVar3 = vpunpckldq_avx2(local_820,auVar9);
        local_2c0 = local_820._0_8_;
        uStack_2b8 = local_820._8_8_;
        uStack_2b0 = local_820._16_8_;
        uStack_2a8 = local_820._24_8_;
        local_2e0 = local_620;
        uStack_2d8 = uStack_618;
        uStack_2d0 = uStack_610;
        uStack_2c8 = uStack_608;
        auVar10._8_8_ = uStack_618;
        auVar10._0_8_ = local_620;
        auVar10._16_8_ = uStack_610;
        auVar10._24_8_ = uStack_608;
        auVar4 = vpunpckhdq_avx2(local_820,auVar10);
        local_8c0 = auVar3._0_8_;
        uStack_8b8 = auVar3._8_8_;
        uStack_8b0 = auVar3._16_8_;
        uStack_8a8 = auVar3._24_8_;
        local_240 = local_660._0_8_;
        uStack_238 = local_660._8_8_;
        uStack_230 = local_660._16_8_;
        uStack_228 = local_660._24_8_;
        local_260 = local_8c0;
        uStack_258 = uStack_8b8;
        uStack_250 = uStack_8b0;
        uStack_248 = uStack_8a8;
        auVar3 = vpaddq_avx2(local_660,auVar3);
        local_660._0_8_ = auVar3._0_8_;
        local_660._8_8_ = auVar3._8_8_;
        local_660._16_8_ = auVar3._16_8_;
        local_660._24_8_ = auVar3._24_8_;
        local_8e0 = auVar4._0_8_;
        uStack_8d8 = auVar4._8_8_;
        uStack_8d0 = auVar4._16_8_;
        uStack_8c8 = auVar4._24_8_;
        local_280 = local_660._0_8_;
        uStack_278 = local_660._8_8_;
        uStack_270 = local_660._16_8_;
        uStack_268 = local_660._24_8_;
        local_2a0 = local_8e0;
        uStack_298 = uStack_8d8;
        uStack_290 = uStack_8d0;
        uStack_288 = uStack_8c8;
        local_660 = vpaddq_avx2(auVar3,auVar4);
      }
      local_5c8 = local_5c8 + 1;
      local_5c0 = auVar11;
    }
    local_a0 = local_6a0[0];
    uStack_98 = local_6a0[1];
    uStack_90 = local_6a0[2];
    uStack_88 = local_6a0[3];
    local_c0 = local_680;
    uStack_b8 = uStack_678;
    uStack_b0 = uStack_670;
    uStack_a8 = uStack_668;
    auVar11._8_8_ = local_6a0[1];
    auVar11._0_8_ = local_6a0[0];
    auVar11._16_8_ = local_6a0[2];
    auVar11._24_8_ = local_6a0[3];
    auVar3._8_8_ = uStack_678;
    auVar3._0_8_ = local_680;
    auVar3._16_8_ = uStack_670;
    auVar3._24_8_ = uStack_668;
    auVar3 = vpackusdw_avx2(auVar11,auVar3);
    in_stack_fffffffffffff700 = auVar3._0_8_;
    in_stack_fffffffffffff708 = auVar3._8_8_;
    in_stack_fffffffffffff710 = auVar3._16_8_;
    uStack_8e8 = auVar3._24_8_;
    local_3e0 = in_stack_fffffffffffff700;
    uStack_3d8 = in_stack_fffffffffffff708;
    lStack_3d0 = in_stack_fffffffffffff710;
    uStack_3c8 = uStack_8e8;
    local_400 = local_620;
    uStack_3f8 = uStack_618;
    uStack_3f0 = uStack_610;
    uStack_3e8 = uStack_608;
    auVar4._8_8_ = uStack_618;
    auVar4._0_8_ = local_620;
    auVar4._16_8_ = uStack_610;
    auVar4._24_8_ = uStack_608;
    auVar3 = vpackuswb_avx2(auVar3,auVar4);
    local_920 = auVar3._0_8_;
    uStackY_918 = auVar3._8_8_;
    uStackY_910 = auVar3._16_8_;
    in_stack_fffffffffffff6f8 = auVar3._24_8_;
    local_60 = local_920;
    uStack_58 = uStackY_918;
    uStack_50 = uStackY_910;
    uStack_48 = in_stack_fffffffffffff6f8;
    local_80 = local_640;
    uStack_78 = uStack_638;
    uStack_70 = uStack_630;
    uStack_68 = uStack_628;
    auVar12._8_8_ = uStack_638;
    auVar12._0_8_ = local_640;
    auVar12._16_8_ = uStack_630;
    auVar12._24_8_ = uStack_628;
    auVar3 = vpermd_avx2(auVar12,auVar3);
    local_940 = auVar3._0_8_;
    uStackY_938 = auVar3._8_8_;
    local_3a8 = local_5d8;
    local_3c0 = local_940;
    uStack_3b8 = uStackY_938;
    *local_5d8 = local_940;
    local_5d8[1] = uStackY_938;
    local_5d8 = local_5d8 + 2;
  }
  if (local_5e0 != (int64_t *)0x0) {
    a[1] = in_stack_fffffffffffff700;
    a[0] = in_stack_fffffffffffff6f8;
    a[2] = in_stack_fffffffffffff708;
    a[3] = in_stack_fffffffffffff710;
    iVar16 = k_means_horizontal_sum_avx2(a);
    *local_5e0 = iVar16;
  }
  return;
}

Assistant:

void av1_calc_indices_dim2_avx2(const int16_t *data, const int16_t *centroids,
                                uint8_t *indices, int64_t *total_dist, int n,
                                int k) {
  const __m256i v_zero = _mm256_setzero_si256();
  const __m256i permute = _mm256_set_epi32(0, 0, 0, 0, 5, 1, 4, 0);
  __m256i sum = _mm256_setzero_si256();
  __m256i ind[2];
  __m256i cents[PALETTE_MAX_SIZE];
  for (int j = 0; j < k; ++j) {
    const int16_t cx = centroids[2 * j], cy = centroids[2 * j + 1];
    cents[j] = _mm256_set_epi16(cy, cx, cy, cx, cy, cx, cy, cx, cy, cx, cy, cx,
                                cy, cx, cy, cx);
  }

  for (int i = 0; i < n; i += 16) {
    for (int l = 0; l < 2; ++l) {
      const __m256i in = _mm256_loadu_si256((__m256i *)data);
      ind[l] = _mm256_setzero_si256();
      // Compute the distance to the first centroid.
      __m256i d1 = _mm256_sub_epi16(in, cents[0]);
      __m256i dist_min = _mm256_madd_epi16(d1, d1);

      for (int j = 1; j < k; ++j) {
        // Compute the distance to the centroid.
        d1 = _mm256_sub_epi16(in, cents[j]);
        const __m256i dist = _mm256_madd_epi16(d1, d1);
        // Compare to the minimal one.
        const __m256i cmp = _mm256_cmpgt_epi32(dist_min, dist);
        dist_min = _mm256_min_epi32(dist_min, dist);
        const __m256i ind1 = _mm256_set1_epi32(j);
        ind[l] = _mm256_or_si256(_mm256_andnot_si256(cmp, ind[l]),
                                 _mm256_and_si256(cmp, ind1));
      }
      if (total_dist) {
        // Convert to 64 bit and add to sum.
        const __m256i dist1 = _mm256_unpacklo_epi32(dist_min, v_zero);
        const __m256i dist2 = _mm256_unpackhi_epi32(dist_min, v_zero);
        sum = _mm256_add_epi64(sum, dist1);
        sum = _mm256_add_epi64(sum, dist2);
      }
      data += 16;
    }
    // Cast to 8 bit and store.
    const __m256i d2 = _mm256_packus_epi32(ind[0], ind[1]);
    const __m256i d3 = _mm256_packus_epi16(d2, v_zero);
    const __m256i d4 = _mm256_permutevar8x32_epi32(d3, permute);
    const __m128i d5 = _mm256_extracti128_si256(d4, 0);
    _mm_storeu_si128((__m128i *)indices, d5);
    indices += 16;
  }
  if (total_dist) {
    *total_dist = k_means_horizontal_sum_avx2(sum);
  }
}